

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::emit_wave_active_op_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Op OVar2;
  Id IVar3;
  Builder *this;
  Operation *this_00;
  Value *value;
  Op s;
  Op fp;
  uint32_t op_kind;
  
  this = Converter::Impl::builder(impl);
  bVar1 = get_constant_operand(&instruction->super_Instruction,2,&op_kind);
  if (!bVar1) {
    return bVar1;
  }
  switch((WaveOpKind)op_kind) {
  case Sum:
    fp = OpGroupNonUniformFAdd;
    s = OpGroupNonUniformIAdd;
    OVar2 = OpGroupNonUniformIAdd;
    break;
  case Product:
    fp = OpGroupNonUniformFMul;
    s = OpGroupNonUniformIMul;
    OVar2 = OpGroupNonUniformIMul;
    break;
  case Min:
    fp = OpGroupNonUniformFMin;
    s = OpGroupNonUniformSMin;
    OVar2 = OpGroupNonUniformUMin;
    break;
  case Max:
    fp = OpGroupNonUniformFMax;
    s = OpGroupNonUniformSMax;
    OVar2 = OpGroupNonUniformUMax;
    break;
  default:
    OVar2 = OpNop;
    goto LAB_0015d0ed;
  }
  OVar2 = select_opcode(instruction,fp,s,OVar2);
LAB_0015d0ed:
  this_00 = Converter::Impl::allocate(impl,OVar2,(Value *)instruction);
  IVar3 = spv::Builder::makeUintConstant(this,3,false);
  Operation::add_id(this_00,IVar3);
  Operation::add_literal(this_00,0);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,value,0);
  if (((impl->execution_model == ExecutionModelFragment) &&
      ((impl->options).strict_helper_lane_waveops == true)) &&
     (((impl->execution_mode_meta).waveops_include_helper_lanes & 1U) == 0)) {
    IVar3 = build_mask_reduction_input_arith(impl,instruction,IVar3,(WaveOpKind)op_kind);
  }
  Operation::add_id(this_00,IVar3);
  Converter::Impl::add(impl,this_00,false);
  spv::Builder::addCapability(this,CapabilityGroupNonUniformArithmetic);
  return bVar1;
}

Assistant:

bool emit_wave_active_op_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	spv::Op opcode = spv::OpNop;

	uint32_t op_kind;
	if (!get_constant_operand(instruction, 2, &op_kind))
		return false;

	switch (DXIL::WaveOpKind(op_kind))
	{
	case DXIL::WaveOpKind::Sum:
		opcode = select_opcode(instruction, spv::OpGroupNonUniformFAdd, spv::OpGroupNonUniformIAdd,
		                       spv::OpGroupNonUniformIAdd);
		break;

	case DXIL::WaveOpKind::Product:
		opcode = select_opcode(instruction, spv::OpGroupNonUniformFMul, spv::OpGroupNonUniformIMul,
		                       spv::OpGroupNonUniformIMul);
		break;

	case DXIL::WaveOpKind::Min:
		opcode = select_opcode(instruction, spv::OpGroupNonUniformFMin, spv::OpGroupNonUniformSMin,
		                       spv::OpGroupNonUniformUMin);
		break;

	case DXIL::WaveOpKind::Max:
		opcode = select_opcode(instruction, spv::OpGroupNonUniformFMax, spv::OpGroupNonUniformSMax,
		                       spv::OpGroupNonUniformUMax);
		break;
	}

	auto *op = impl.allocate(opcode, instruction);
	op->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	op->add_literal(spv::GroupOperationReduce);

	spv::Id input_value = impl.get_id_for_value(instruction->getOperand(1));
	if (wave_op_needs_helper_lane_masking(impl))
		input_value = build_mask_reduction_input_arith(impl, instruction, input_value, DXIL::WaveOpKind(op_kind));

	op->add_id(input_value);

	impl.add(op);

	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	return true;
}